

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dp.c
# Opt level: O3

DP_RS_Stream
MpiInitReader(CP_Services Svcs,void *CP_Stream,void **ReaderContactInfoPtr,_SstParams *Params,
             attr_list WriterContact,SstStats Stats)

{
  uint uVar1;
  undefined8 *puVar2;
  CManager p_Var3;
  SMPI_Comm comm;
  ulong uVar4;
  undefined8 uVar5;
  
  puVar2 = (undefined8 *)calloc(0x90,1);
  p_Var3 = (*Svcs->getCManager)(CP_Stream);
  comm = (*Svcs->getMPIComm)(CP_Stream);
  *puVar2 = CP_Stream;
  uVar1 = getpid();
  uVar4 = gethostid();
  puVar2[2] = uVar4 & 0xffffffff | (ulong)uVar1 << 0x20;
  puVar2[5] = Stats;
  SMPI_Comm_rank(comm,(int *)(puVar2 + 1));
  uVar5 = CMregister_format(p_Var3,MpiReadRequestStructs);
  puVar2[6] = uVar5;
  uVar5 = CMregister_format(p_Var3,MpiReadReplyStructs);
  CMregister_handler(uVar5,MpiReadReplyHandler,Svcs);
  snprintf((char *)(puVar2 + 7),0x40,"Reader Rank %d",(ulong)*(uint *)(puVar2 + 1));
  puVar2[0xf] = puVar2;
  *ReaderContactInfoPtr = puVar2 + 7;
  (*Svcs->verbose)((void *)*puVar2,5,"MPI dataplane reader initialized, reader rank %d\n",
                   (ulong)*(uint *)(puVar2 + 1));
  return puVar2;
}

Assistant:

static DP_RS_Stream MpiInitReader(CP_Services Svcs, void *CP_Stream, void **ReaderContactInfoPtr,
                                  struct _SstParams *Params, attr_list WriterContact,
                                  SstStats Stats)
{
    MpiStreamRD Stream = calloc(sizeof(struct _MpiStreamRD), 1);
    CManager cm = Svcs->getCManager(CP_Stream);
    SMPI_Comm comm = Svcs->getMPIComm(CP_Stream);
    CMFormat F;

    Stream->Stream.CP_Stream = CP_Stream;
    Stream->Stream.taskID = GetUniqueTaskId();
    Stream->Link.Stats = Stats;

    SMPI_Comm_rank(comm, &Stream->Stream.Rank);

    /* add a handler for read reply messages */
    Stream->ReadRequestFormat = CMregister_format(cm, MpiReadRequestStructs);
    F = CMregister_format(cm, MpiReadReplyStructs);
    CMregister_handler(F, MpiReadReplyHandler, Svcs);

    /* Generate Contact info */
    snprintf(Stream->MyContactInfo.ContactString, MPI_DP_CONTACT_STRING_LEN, "Reader Rank %d",
             Stream->Stream.Rank);
    Stream->MyContactInfo.StreamRS = Stream;
    *ReaderContactInfoPtr = &Stream->MyContactInfo;

    Svcs->verbose(Stream->Stream.CP_Stream, DPTraceVerbose,
                  "MPI dataplane reader initialized, reader rank %d\n", Stream->Stream.Rank);

    return Stream;
}